

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O3

void __thiscall
CBlockPolicyEstimator::processTransaction(CBlockPolicyEstimator *this,NewMempoolTransactionInfo *tx)

{
  map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
  *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  const_iterator cVar5;
  Logger *this_01;
  mapped_type *pmVar6;
  Txid *__k;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  CFeeRate feeRate;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock1.super_unique_lock._M_device = &(this->m_cs_fee_estimator).super_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock1.super_unique_lock);
  uVar4 = (tx->info).txHeight;
  __k = &((tx->info).m_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
         ->hash;
  this_00 = &this->mapMemPoolTxs;
  cVar5 = std::
          _Rb_tree<uint256,_std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>,_std::_Select1st<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
          ::find(&this_00->_M_t,&__k->m_wrapped);
  if ((_Rb_tree_header *)cVar5._M_node == &(this->mapMemPoolTxs)._M_t._M_impl.super__Rb_tree_header)
  {
    if (uVar4 == this->nBestSeenHeight) {
      if ((((tx->m_mempool_limit_bypassed == false) && (tx->m_submitted_in_package == false)) &&
          (tx->m_chainstate_is_current == true)) && (tx->m_has_no_mempool_parents != false)) {
        this->trackedTxs = this->trackedTxs + 1;
        CFeeRate::CFeeRate(&feeRate,&(tx->info).m_fee,
                           (uint32_t)(tx->info).m_virtual_transaction_size);
        pmVar6 = std::
                 map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                 ::operator[](this_00,&__k->m_wrapped);
        pmVar6->blockHeight = uVar4;
        uVar2 = TxConfirmStats::NewTx
                          ((this->feeStats)._M_t.
                           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                           .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,uVar4,
                           (double)feeRate.nSatoshisPerK);
        pmVar6 = std::
                 map<uint256,_CBlockPolicyEstimator::TxStatsInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_CBlockPolicyEstimator::TxStatsInfo>_>_>
                 ::operator[](this_00,&__k->m_wrapped);
        pmVar6->bucketIndex = uVar2;
        uVar3 = TxConfirmStats::NewTx
                          ((this->shortStats)._M_t.
                           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                           .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,uVar4,
                           (double)feeRate.nSatoshisPerK);
        if (uVar2 != uVar3) {
          __assert_fail("bucketIndex == bucketIndex2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                        ,0x278,
                        "void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo &)"
                       );
        }
        uVar4 = TxConfirmStats::NewTx
                          ((this->longStats)._M_t.
                           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                           .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,uVar4,
                           (double)feeRate.nSatoshisPerK);
        if (uVar2 != uVar4) {
          __assert_fail("bucketIndex == bucketIndex3",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                        ,0x27a,
                        "void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo &)"
                       );
        }
      }
      else {
        this->untrackedTxs = this->untrackedTxs + 1;
      }
    }
  }
  else {
    this_01 = LogInstance();
    bVar1 = BCLog::Logger::WillLogCategoryLevel(this_01,ESTIMATEFEE,Debug);
    if (bVar1) {
      base_blob<256u>::ToString_abi_cxx11_((string *)&feeRate,__k);
      logging_function._M_str = "processTransaction";
      logging_function._M_len = 0x12;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
      ;
      source_file._M_len = 0x5f;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,599,ESTIMATEFEE,Debug,
                 (ConstevalFormatString<1U>)0x7f286a,(string *)&feeRate);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)feeRate.nSatoshisPerK != &local_40) {
        operator_delete((void *)feeRate.nSatoshisPerK,local_40._M_allocated_capacity + 1);
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBlockPolicyEstimator::processTransaction(const NewMempoolTransactionInfo& tx)
{
    LOCK(m_cs_fee_estimator);
    const unsigned int txHeight = tx.info.txHeight;
    const auto& hash = tx.info.m_tx->GetHash();
    if (mapMemPoolTxs.count(hash)) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error mempool tx %s already being tracked\n",
                 hash.ToString());
        return;
    }

    if (txHeight != nBestSeenHeight) {
        // Ignore side chains and re-orgs; assuming they are random they don't
        // affect the estimate.  We'll potentially double count transactions in 1-block reorgs.
        // Ignore txs if BlockPolicyEstimator is not in sync with ActiveChain().Tip().
        // It will be synced next time a block is processed.
        return;
    }
    // This transaction should only count for fee estimation if:
    // - it's not being re-added during a reorg which bypasses typical mempool fee limits
    // - the node is not behind
    // - the transaction is not dependent on any other transactions in the mempool
    // - it's not part of a package.
    const bool validForFeeEstimation = !tx.m_mempool_limit_bypassed && !tx.m_submitted_in_package && tx.m_chainstate_is_current && tx.m_has_no_mempool_parents;

    // Only want to be updating estimates when our blockchain is synced,
    // otherwise we'll miscalculate how many blocks its taking to get included.
    if (!validForFeeEstimation) {
        untrackedTxs++;
        return;
    }
    trackedTxs++;

    // Feerates are stored and reported as BTC-per-kb:
    const CFeeRate feeRate(tx.info.m_fee, tx.info.m_virtual_transaction_size);

    mapMemPoolTxs[hash].blockHeight = txHeight;
    unsigned int bucketIndex = feeStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    mapMemPoolTxs[hash].bucketIndex = bucketIndex;
    unsigned int bucketIndex2 = shortStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    assert(bucketIndex == bucketIndex2);
    unsigned int bucketIndex3 = longStats->NewTx(txHeight, static_cast<double>(feeRate.GetFeePerK()));
    assert(bucketIndex == bucketIndex3);
}